

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlkf.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::LocaleKeyFactory::getDisplayName
          (LocaleKeyFactory *this,UnicodeString *id,Locale *locale,UnicodeString *result)

{
  Locale loc;
  Locale local_100;
  
  if ((this->_coverage & 1) == 0) {
    Locale::Locale(&local_100);
    LocaleUtility::initLocaleFromName(id,&local_100);
    result = Locale::getDisplayName(&local_100,locale,result);
    Locale::~Locale(&local_100);
  }
  else {
    UnicodeString::setToBogus(result);
  }
  return result;
}

Assistant:

UnicodeString&
LocaleKeyFactory::getDisplayName(const UnicodeString& id, const Locale& locale, UnicodeString& result) const {
    if ((_coverage & 0x1) == 0) {
        //UErrorCode status = U_ZERO_ERROR;
        // assume if this is called on us, we support some fallback of this id
        // if (isSupportedID(id, status)) {
            Locale loc;
            LocaleUtility::initLocaleFromName(id, loc);
            return loc.getDisplayName(locale, result);
        // }
    }
    result.setToBogus();
    return result;
}